

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *this_00;
  StringBlock *string_block;
  Chunk *pCVar2;
  size_t sVar3;
  SerialArenaChunk *this_01;
  Chunk *pCVar4;
  ulong uVar5;
  void *pvVar6;
  _func_void_void_ptr_size_t *in_RSI;
  GetDeallocator GVar7;
  ThreadSafeArena *this_02;
  long lVar8;
  GetDeallocator deallocator;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar9;
  SizedPtr SVar10;
  
  uVar5 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar5 == 0) {
    deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar5 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  do {
    if (((ulong)this_01 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_01 + 8) == 0) {
      SVar10 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                         (&this->first_arena_,deallocator);
      return SVar10;
    }
    pSVar1 = *(SerialArenaChunk **)this_01;
    SVar9 = SerialArenaChunk::arenas(this_01);
    if (SVar9.len_ != 0) {
      lVar8 = SVar9.len_ << 3;
      do {
        this_00 = *(SerialArena **)((long)&SVar9.ptr_[-1]._M_b._M_p + lVar8);
        if (this_00 == (SerialArena *)0x0) {
          Free((ThreadSafeArena *)&stack0xffffffffffffffc0);
          GVar7.dealloc_ = in_RSI;
LAB_00135d91:
          this_02 = (ThreadSafeArena *)&stack0xffffffffffffffc0;
          Free(this_02);
          string_block = (StringBlock *)(this_02->first_arena_).limit_;
          if (string_block != (StringBlock *)0x0) {
            SerialArena::FreeStringBlocks
                      (string_block,(size_t)(this_02->first_arena_).prefetch_ptr_);
          }
          pCVar2 = (this_02->first_arena_).cleanup_list_.head_;
          sVar3 = pCVar2->size;
          for (pCVar4 = pCVar2->next; pCVar4 != (Chunk *)0x0; pCVar4 = pCVar4->next) {
            if (GVar7.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
              operator_delete(pCVar2,sVar3);
            }
            else {
              (*GVar7.dealloc_)(pCVar2,sVar3);
            }
            sVar3 = pCVar4->size;
            pCVar2 = pCVar4;
          }
          SVar10.n = sVar3;
          SVar10.p = pCVar2;
          return SVar10;
        }
        GVar7.dealloc_ = deallocator.dealloc_;
        SVar10 = SerialArena::
                 Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                           (this_00,deallocator);
        in_RSI = (_func_void_void_ptr_size_t *)SVar10.n;
        pvVar6 = SVar10.p;
        if (pvVar6 == (void *)0x0) goto LAB_00135d91;
        if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
          operator_delete(pvVar6,(ulong)in_RSI);
        }
        else {
          (*deallocator.dealloc_)(pvVar6,(size_t)in_RSI);
        }
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    in_RSI = (_func_void_void_ptr_size_t *)((ulong)*(uint *)(this_01 + 8) * 0x10 + 0x10);
    operator_delete(this_01,(ulong)in_RSI);
    this_01 = pSVar1;
  } while( true );
}

Assistant:

SizedPtr ThreadSafeArena::Free() {
  auto deallocator = GetDeallocator(alloc_policy_.get());

  WalkSerialArenaChunk([&](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last. Freeing
    // in reverse-order to the order in which objects were created may not be
    // necessary to Free and we should revisit this. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      // Always frees the first block of "serial" as it cannot be user-provided.
      SizedPtr mem = serial->Free(deallocator);
      ABSL_DCHECK_NE(mem.p, nullptr);
      deallocator(mem);
    }

    // Delete the chunk as we're done with it.
    internal::SizedDelete(chunk,
                          SerialArenaChunk::AllocSize(chunk->capacity()));
  });

  // The first block of the first arena is special and let the caller handle it.
  return first_arena_.Free(deallocator);
}